

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EnumTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::EnumTypeSyntax,slang::syntax::EnumTypeSyntax_const&>
          (BumpAllocator *this,EnumTypeSyntax *args)

{
  EnumTypeSyntax *pEVar1;
  EnumTypeSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pEVar1 = (EnumTypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::EnumTypeSyntax::EnumTypeSyntax(in_RSI,pEVar1);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }